

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O2

REF_STATUS
ref_recon_extrapolate_kexact(REF_GRID ref_grid,REF_DBL *recon,REF_BOOL *replace,REF_INT ldim)

{
  double dVar1;
  REF_NODE ref_node;
  REF_ADJ pRVar2;
  REF_ADJ_ITEM pRVar3;
  double dVar4;
  double dVar5;
  REF_CLOUD pRVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  REF_CLOUD *one_layer;
  long lVar11;
  REF_DBL *a;
  REF_DBL *q;
  REF_DBL *r;
  REF_DBL *pRVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  REF_DBL *pRVar16;
  undefined8 uVar17;
  long lVar18;
  long global;
  REF_DBL *pRVar19;
  char *pcVar20;
  double *pdVar21;
  long lVar22;
  REF_CLOUD *ref_cloud_ptr;
  ulong uVar23;
  REF_CELL pRVar24;
  ulong uVar25;
  REF_CLOUD ref_cloud;
  ulong local_430;
  long local_428;
  REF_DBL local_420;
  long local_418;
  long local_410;
  long local_408;
  REF_GRID local_400;
  double local_3f8 [10];
  REF_DBL local_3a8 [100];
  double adStack_88 [9];
  REF_DBL local_40;
  
  ref_node = ref_grid->node;
  if (ref_grid->twod == 0) {
    pRVar24 = ref_grid->cell[8];
  }
  else {
    pRVar24 = ref_grid->cell[3];
  }
  local_400 = ref_grid;
  uVar7 = ref_node_ghost_int(ref_node,replace,ldim);
  if (uVar7 == 0) {
    uVar7 = ref_node_ghost_dbl(ref_node,recon,ldim);
    if (uVar7 == 0) {
      uVar23 = 0;
      if (0 < ldim) {
        uVar23 = (ulong)(uint)ldim;
      }
      lVar22 = (long)ldim;
      for (uVar13 = 0; uVar13 != uVar23; uVar13 = uVar13 + 1) {
        uVar25 = (ulong)ref_node->max;
        if ((long)uVar25 < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
                 0x4a7,"ref_recon_extrapolate_kexact","malloc one_layer of REF_CLOUD negative");
          return 1;
        }
        one_layer = (REF_CLOUD *)malloc(uVar25 * 8);
        if (one_layer == (REF_CLOUD *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
                 0x4a7,"ref_recon_extrapolate_kexact","malloc one_layer of REF_CLOUD NULL");
          return 2;
        }
        for (uVar14 = 0; uVar25 != uVar14; uVar14 = uVar14 + 1) {
          one_layer[uVar14] = (REF_CLOUD)0x0;
        }
        ref_cloud_ptr = one_layer;
        local_428 = lVar22;
        for (lVar18 = 0; lVar18 < (int)uVar25; lVar18 = lVar18 + 1) {
          if (-1 < ref_node->global[lVar18]) {
            uVar7 = ref_cloud_create(ref_cloud_ptr,4);
            if (uVar7 != 0) {
              uVar23 = (ulong)uVar7;
              pcVar20 = "cloud storage";
              uVar17 = 0x4a9;
              goto LAB_001cd762;
            }
            uVar25 = (ulong)(uint)ref_node->max;
          }
          ref_cloud_ptr = ref_cloud_ptr + 1;
        }
        local_430 = uVar23;
        for (lVar22 = 0; lVar22 < (int)uVar25; lVar22 = lVar22 + 1) {
          if ((-1 < ref_node->global[lVar22]) && (ref_node->ref_mpi->id == ref_node->part[lVar22]))
          {
            pRVar2 = pRVar24->ref_adj;
            iVar8 = -1;
            uVar23 = 0xffffffff;
            if (lVar22 < pRVar2->nnode) {
              uVar7 = pRVar2->first[lVar22];
              iVar8 = -1;
              uVar23 = 0xffffffff;
              if ((long)(int)uVar7 != -1) {
                iVar8 = pRVar2->item[(int)uVar7].ref;
                uVar23 = (ulong)uVar7;
              }
            }
            while ((int)uVar23 != -1) {
              for (lVar18 = 0; (int)lVar18 < pRVar24->node_per; lVar18 = lVar18 + 1) {
                uVar7 = pRVar24->c2n[(long)pRVar24->size_per * (long)iVar8 + lVar18];
                lVar11 = (long)(int)(uVar7 * ldim) + uVar13;
                if (replace[lVar11] == 0) {
                  global = -1;
                  if (((-1 < (int)uVar7) && ((int)uVar7 < ref_node->max)) &&
                     (global = ref_node->global[uVar7], global < 0)) {
                    global = -1;
                  }
                  lVar15 = (long)(int)uVar7;
                  pRVar16 = ref_node->real;
                  local_3a8[0] = pRVar16[lVar15 * 0xf];
                  local_3a8[1] = pRVar16[lVar15 * 0xf + 1];
                  local_3a8[2] = pRVar16[lVar15 * 0xf + 2];
                  local_3a8[3] = recon[lVar11];
                  uVar7 = ref_cloud_store(one_layer[lVar22],global,local_3a8);
                  if (uVar7 != 0) {
                    uVar23 = (ulong)uVar7;
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                           ,0x48e,"ref_recon_local_immediate_replace_cloud",(ulong)uVar7,
                           "store cloud stencil");
                    pcVar20 = "fill";
                    uVar17 = 0x4ad;
                    goto LAB_001cd762;
                  }
                }
              }
              pRVar3 = pRVar24->ref_adj->item;
              uVar23 = (ulong)pRVar3[(int)uVar23].next;
              iVar8 = -1;
              if (uVar23 != 0xffffffffffffffff) {
                iVar8 = pRVar3[uVar23].ref;
              }
            }
            uVar25 = (ulong)(uint)ref_node->max;
            uVar23 = local_430;
          }
        }
        uVar7 = ref_recon_ghost_cloud(one_layer,ref_node);
        if (uVar7 != 0) {
          uVar23 = (ulong)uVar7;
          pcVar20 = "fill ghosts";
          uVar17 = 0x4ae;
          goto LAB_001cd762;
        }
        lVar22 = local_428;
        for (lVar18 = 0; uVar25 = (ulong)ref_node->max, lVar18 < (long)uVar25; lVar18 = lVar18 + 1)
        {
          if (((-1 < ref_node->global[lVar18]) && (ref_node->ref_mpi->id == ref_node->part[lVar18]))
             && (lVar11 = lVar18 * lVar22 + uVar13, replace[lVar11] != 0)) {
            local_418 = lVar11;
            uVar7 = ref_cloud_deep_copy(&ref_cloud,one_layer[lVar18]);
            if (uVar7 != 0) {
              uVar23 = (ulong)uVar7;
              pcVar20 = "create ref_cloud";
              uVar17 = 0x4b2;
              goto LAB_001cd762;
            }
            local_408 = lVar18 * 0x78;
            uVar9 = 3;
            local_410 = lVar18;
            for (uVar7 = 2; (pRVar6 = ref_cloud, uVar9 != 0 && (uVar7 < 9)); uVar7 = uVar7 + 1) {
              uVar10 = ref_cloud->n;
              uVar23 = (ulong)uVar10;
              uVar9 = 4;
              if ((int)uVar10 < 10) {
LAB_001cd5fe:
                uVar10 = ref_recon_grow_cloud_one_layer(ref_cloud,one_layer,ref_node);
                if (uVar10 != 0) {
                  uVar23 = (ulong)uVar10;
                  pcVar20 = "grow";
                  uVar17 = 0x4bc;
                  goto LAB_001cd762;
                }
              }
              else {
                pRVar16 = ref_node->real;
                a = (REF_DBL *)malloc(uVar23 * 0x50);
                if (a == (REF_DBL *)0x0) {
                  uVar17 = 0x27a;
LAB_001cd4a0:
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                         ,uVar17,"ref_recon_kexact_center");
                  uVar9 = 2;
                  goto LAB_001cd5fe;
                }
                q = (REF_DBL *)malloc(uVar23 * 0x50);
                if (q == (REF_DBL *)0x0) {
                  uVar17 = 0x27b;
                  goto LAB_001cd4a0;
                }
                r = (REF_DBL *)malloc(800);
                if (r == (REF_DBL *)0x0) {
                  uVar17 = 0x27c;
                  goto LAB_001cd4a0;
                }
                pRVar12 = pRVar6->aux;
                iVar8 = pRVar6->naux;
                pdVar21 = (double *)((long)pRVar16 + local_408);
                dVar4 = *pdVar21;
                dVar5 = pdVar21[1];
                dVar1 = *(double *)((long)pRVar16 + local_408 + 0x10);
                pRVar16 = a;
                for (uVar25 = 0; uVar25 != uVar23; uVar25 = uVar25 + 1) {
                  lVar22 = (long)(int)uVar25 * (long)iVar8;
                  local_3f8[8] = pRVar12[lVar22 + 2] - dVar1;
                  pdVar21 = pRVar12 + lVar22;
                  local_3f8[6] = *pdVar21 - dVar4;
                  local_3f8[7] = pdVar21[1] - dVar5;
                  local_3f8[0] = local_3f8[6] * 0.5 * local_3f8[6];
                  local_3f8[1] = local_3f8[7] * local_3f8[6];
                  local_3f8[2] = local_3f8[8] * local_3f8[6];
                  local_3f8[3] = local_3f8[7] * 0.5 * local_3f8[7];
                  local_3f8[4] = local_3f8[7] * local_3f8[8];
                  local_3f8[5] = local_3f8[8] * 0.5 * local_3f8[8];
                  local_3f8[9] = 1.0;
                  pRVar19 = pRVar16;
                  for (lVar22 = 0; lVar22 != 10; lVar22 = lVar22 + 1) {
                    *pRVar19 = local_3f8[lVar22];
                    pRVar19 = pRVar19 + uVar23;
                  }
                  pRVar16 = pRVar16 + 1;
                }
                uVar9 = ref_matrix_qr(uVar10,10,a,q,r);
                if (uVar9 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                         ,0x29c,"ref_recon_kexact_center",(ulong)uVar9,"kexact lsq hess qr");
                  free(r);
LAB_001cd448:
                  free(q);
                  free(a);
                  goto LAB_001cd5fe;
                }
                for (lVar22 = 0; lVar22 != 0x6e; lVar22 = lVar22 + 1) {
                  local_3a8[lVar22] = 0.0;
                }
                pRVar16 = local_3a8;
                pRVar12 = r;
                for (lVar22 = 0; lVar22 != 10; lVar22 = lVar22 + 1) {
                  for (lVar18 = 0; lVar18 != 800; lVar18 = lVar18 + 0x50) {
                    *(double *)((long)pRVar16 + lVar18) =
                         *(double *)((long)pRVar12 + lVar18) + *(double *)((long)pRVar16 + lVar18);
                  }
                  pRVar16 = pRVar16 + 1;
                  pRVar12 = pRVar12 + 1;
                }
                uVar9 = pRVar6->n;
                uVar25 = 0;
                if (0 < (int)uVar9) {
                  uVar25 = (ulong)uVar9;
                }
                pRVar16 = q;
                for (uVar14 = 0; uVar14 != uVar25; uVar14 = uVar14 + 1) {
                  pRVar12 = pRVar6->aux;
                  iVar8 = pRVar6->naux;
                  pdVar21 = pRVar16;
                  for (lVar22 = 0; lVar22 != 10; lVar22 = lVar22 + 1) {
                    adStack_88[lVar22] =
                         *pdVar21 * pRVar12[(long)(int)uVar14 * (long)iVar8 + 3] +
                         adStack_88[lVar22];
                    pdVar21 = pdVar21 + uVar23;
                  }
                  pRVar16 = pRVar16 + 1;
                }
                if (uVar9 != uVar10) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                         ,0x2b4,"ref_recon_kexact_center","b row miscount",uVar23,uVar25);
                  free(r);
                  free(q);
                  free(a);
                  uVar9 = 1;
                  goto LAB_001cd5fe;
                }
                uVar9 = ref_matrix_solve_ab(10,0xb,local_3a8);
                if (uVar9 != 0) {
                  free(r);
                  goto LAB_001cd448;
                }
                local_420 = local_40;
                free(r);
                free(q);
                free(a);
                recon[local_418] = local_420;
                replace[local_418] = 0;
                uVar9 = 0;
              }
            }
            uVar7 = ref_cloud_free(ref_cloud);
            lVar18 = local_410;
            lVar22 = local_428;
            uVar23 = local_430;
            if (uVar7 != 0) {
              uVar23 = (ulong)uVar7;
              pcVar20 = "free ref_cloud";
              uVar17 = 0x4bf;
              goto LAB_001cd762;
            }
          }
        }
        for (lVar18 = 0; lVar18 < (int)uVar25; lVar18 = lVar18 + 1) {
          if (-1 < ref_node->global[lVar18]) {
            ref_cloud_free(one_layer[lVar18]);
            uVar25 = (ulong)(uint)ref_node->max;
          }
        }
        free(one_layer);
      }
      uVar7 = ref_node_ghost_int(ref_node,replace,ldim);
      if (uVar7 == 0) {
        uVar7 = ref_node_ghost_dbl(ref_node,recon,ldim);
        if (uVar7 == 0) {
          uVar7 = ref_recon_extrapolate_zeroth(local_400,recon,replace,ldim);
          if (uVar7 == 0) {
            return 0;
          }
          uVar23 = (ulong)uVar7;
          pcVar20 = "zero";
          uVar17 = 0x4cc;
        }
        else {
          uVar23 = (ulong)uVar7;
          pcVar20 = "update ghosts";
          uVar17 = 0x4ca;
        }
      }
      else {
        uVar23 = (ulong)uVar7;
        pcVar20 = "update ghosts";
        uVar17 = 0x4c9;
      }
    }
    else {
      uVar23 = (ulong)uVar7;
      pcVar20 = "update ghosts";
      uVar17 = 0x4a4;
    }
  }
  else {
    uVar23 = (ulong)uVar7;
    pcVar20 = "update ghosts";
    uVar17 = 0x4a3;
  }
LAB_001cd762:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",uVar17,
         "ref_recon_extrapolate_kexact",uVar23,pcVar20);
  return (REF_STATUS)uVar23;
}

Assistant:

REF_FCN REF_STATUS ref_recon_extrapolate_kexact(REF_GRID ref_grid,
                                                REF_DBL *recon,
                                                REF_BOOL *replace,
                                                REF_INT ldim) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_INT i, node;
  REF_CLOUD *one_layer, ref_cloud;
  REF_DBL center;
  REF_STATUS status;
  REF_INT layer;
  if (ref_grid_twod(ref_grid)) ref_cell = ref_grid_tri(ref_grid);

  RSS(ref_node_ghost_int(ref_node, replace, ldim), "update ghosts");
  RSS(ref_node_ghost_dbl(ref_node, recon, ldim), "update ghosts");

  for (i = 0; i < ldim; i++) {
    ref_malloc_init(one_layer, ref_node_max(ref_node), REF_CLOUD, NULL);
    each_ref_node_valid_node(ref_node, node) {
      RSS(ref_cloud_create(&(one_layer[node]), 4), "cloud storage");
    }
    RSS(ref_recon_local_immediate_replace_cloud(one_layer, ref_node, ref_cell,
                                                recon, replace, ldim, i),
        "fill");
    RSS(ref_recon_ghost_cloud(one_layer, ref_node), "fill ghosts");
    each_ref_node_valid_node(ref_node, node) {
      if (ref_node_owned(ref_node, node) && replace[i + ldim * node]) {
        RSS(ref_cloud_deep_copy(&ref_cloud, one_layer[node]),
            "create ref_cloud");
        status = REF_INVALID;
        for (layer = 2; status != REF_SUCCESS && layer <= 8; layer++) {
          status = ref_recon_kexact_center(ref_node_xyz_ptr(ref_node, node),
                                           ref_cloud, &center);
          if (REF_SUCCESS == status) {
            recon[i + ldim * node] = center;
            replace[i + ldim * node] = REF_FALSE;
          } else {
            RSS(ref_recon_grow_cloud_one_layer(ref_cloud, one_layer, ref_node),
                "grow");
          }
        }
        RSS(ref_cloud_free(ref_cloud), "free ref_cloud");
      }
    }

    each_ref_node_valid_node(ref_node, node) {
      ref_cloud_free(one_layer[node]); /* no-op for null */
    }
    ref_free(one_layer);
  }

  RSS(ref_node_ghost_int(ref_node, replace, ldim), "update ghosts");
  RSS(ref_node_ghost_dbl(ref_node, recon, ldim), "update ghosts");

  RSS(ref_recon_extrapolate_zeroth(ref_grid, recon, replace, ldim), "zero");

  return REF_SUCCESS;
}